

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_target.cpp
# Opt level: O2

bool __thiscall RenderTarget::save_image(RenderTarget *this,string *file)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t y;
  uint uVar3;
  ostream *poVar4;
  pointer pCVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  undefined2 local_5c;
  uint8_t local_5a;
  vector<Color24,_std::allocator<Color24>_> img;
  string file_ext;
  
  std::__cxx11::string::rfind((char *)file,0x10d300);
  std::__cxx11::string::substr((ulong)&file_ext,(ulong)file);
  bVar2 = std::operator==(&file_ext,"ppm");
  if (bVar2) {
    std::vector<Color24,_std::allocator<Color24>_>::vector
              (&img,(ulong)(this->height * this->width),(allocator_type *)&local_5c);
    get_colorbuf(this,&img);
    bVar2 = save_ppm(this,file,
                     &(img.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                       super__Vector_impl_data._M_start)->r);
  }
  else {
    bVar2 = std::operator==(&file_ext,"bmp");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Unsupported output image format: ");
      poVar4 = std::operator<<(poVar4,(string *)&file_ext);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar2 = false;
      goto LAB_0010a693;
    }
    std::vector<Color24,_std::allocator<Color24>_>::vector
              (&img,(ulong)(this->height * this->width),(allocator_type *)&local_5c);
    get_colorbuf(this,&img);
    iVar6 = -1;
    for (uVar3 = 0;
        pCVar5 = img.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar3 < this->height >> 1; uVar3 = uVar3 + 1) {
      uVar10 = this->width;
      uVar7 = uVar10 * uVar3;
      uVar8 = (this->height + iVar6) * uVar10;
      for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        local_5a = pCVar5[uVar7].b;
        local_5c._0_1_ = pCVar5[uVar7].r;
        local_5c._1_1_ = pCVar5[uVar7].g;
        pCVar5[uVar7].b = pCVar5[uVar8].b;
        uVar1 = pCVar5[uVar8].g;
        pCVar5[uVar7].r = pCVar5[uVar8].r;
        pCVar5[uVar7].g = uVar1;
        pCVar5[uVar8].b = local_5a;
        pCVar5[uVar8].r = (undefined1)local_5c;
        pCVar5[uVar8].g = local_5c._1_1_;
        pCVar5 = pCVar5 + 1;
        uVar10 = this->width;
      }
      iVar6 = iVar6 + -1;
    }
    for (; pCVar5 != img.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                     super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
      uVar1 = pCVar5->r;
      pCVar5->r = pCVar5->b;
      pCVar5->b = uVar1;
    }
    bVar2 = save_bmp(this,file,
                     &(img.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                       super__Vector_impl_data._M_start)->r);
  }
  std::_Vector_base<Color24,_std::allocator<Color24>_>::~_Vector_base
            (&img.super__Vector_base<Color24,_std::allocator<Color24>_>);
LAB_0010a693:
  std::__cxx11::string::~string((string *)&file_ext);
  return bVar2;
}

Assistant:

bool RenderTarget::save_image(const std::string &file) const {
	// Compute the correct image from the saved pixel data and write
	// it to the desired file
	std::string file_ext = file.substr(file.rfind(".") + 1);
	if (file_ext == "ppm"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		return save_ppm(file, &img[0].r);
	}
	if (file_ext == "bmp"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		//Do y-flip for BMP since BMP starts at the bottom-left
		for (uint32_t y = 0; y < height / 2; ++y){
			Color24 *a = &img[y * width];
			Color24 *b = &img[(height - y - 1) * width];
			for (uint32_t x = 0; x < width; ++x){
				std::swap(a[x], b[x]);
			}
		}
		// We also need to convert to BGRA order for BMP
		for (auto &c : img){
			std::swap(c.r, c.b);
		}
		return save_bmp(file, &img[0].r);
	}
	std::cout << "Unsupported output image format: " << file_ext << std::endl;
	return false;
}